

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::DummySamplerForCombinedImageHandler::handle
          (DummySamplerForCombinedImageHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint id;
  uint32_t uVar1;
  uint32_t chain;
  SPIRVariable *pSVar2;
  SPIRType *pSVar3;
  ulong uVar4;
  bool local_32;
  bool local_31;
  uint32_t result_type;
  uint32_t result_type_1;
  
  if (this->need_dummy_sampler == false) {
    uVar4 = (ulong)(opcode - OpLoad);
    if (0x2e < opcode - OpLoad) {
      return true;
    }
    if ((0x6c0400000000U >> (uVar4 & 0x3f) & 1) != 0) {
      pSVar2 = maybe_get_backing_variable(this->compiler,args[2]);
      if (pSVar2 == (SPIRVariable *)0x0) {
        return true;
      }
      pSVar3 = get<spirv_cross::SPIRType>
                         (this->compiler,*(uint32_t *)&(pSVar2->super_IVariant).field_0xc);
      if (*(int *)&(pSVar3->super_IVariant).field_0xc != 0x10) {
        return true;
      }
      if ((pSVar3->image).sampled != 1) {
        return true;
      }
      if ((pSVar3->image).dim == DimBuffer) {
        return true;
      }
      this->need_dummy_sampler = true;
      return true;
    }
    if ((0x70UL >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 != 0) {
        return true;
      }
      if (2 < length) {
        result_type_1 = *args;
        pSVar3 = get<spirv_cross::SPIRType>(this->compiler,result_type_1);
        if (*(int *)&(pSVar3->super_IVariant).field_0xc != 0x10) {
          return true;
        }
        if ((pSVar3->image).sampled != 1) {
          return true;
        }
        if ((pSVar3->image).dim == DimBuffer) {
          return true;
        }
        uVar1 = args[1];
        chain = args[2];
        local_31 = true;
        set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                  (this->compiler,uVar1,(char (*) [1])0x375a3a,&result_type_1,&local_31);
        register_read(this->compiler,uVar1,chain,true);
        return true;
      }
    }
    else if (2 < length) {
      result_type = *args;
      pSVar3 = get<spirv_cross::SPIRType>(this->compiler,result_type);
      if (*(int *)&(pSVar3->super_IVariant).field_0xc != 0x10) {
        return true;
      }
      if ((pSVar3->image).sampled != 1) {
        return true;
      }
      if ((pSVar3->image).dim == DimBuffer) {
        return true;
      }
      id = args[1];
      uVar1 = args[2];
      local_32 = true;
      set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                (this->compiler,id,(char (*) [1])0x375a3a,&result_type,&local_32);
      register_read(this->compiler,id,uVar1,true);
      (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[id].allow_type_rewrite =
           true;
      return true;
    }
  }
  return false;
}

Assistant:

bool Compiler::DummySamplerForCombinedImageHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	if (need_dummy_sampler)
	{
		// No need to traverse further, we know the result.
		return false;
	}

	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image =
		    type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer;

		// If not separate image, don't bother.
		if (!separate_image)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		break;
	}

	case OpImageFetch:
	case OpImageQuerySizeLod:
	case OpImageQuerySize:
	case OpImageQueryLevels:
	case OpImageQuerySamples:
	{
		// If we are fetching or querying LOD from a plain OpTypeImage, we must pre-combine with our dummy sampler.
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (var)
		{
			auto &type = compiler.get<SPIRType>(var->basetype);
			if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
				need_dummy_sampler = true;
		}

		break;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];
		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image =
		    type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer;
		if (!separate_image)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);

		// Other backends might use SPIRAccessChain for this later.
		compiler.ir.ids[id].set_allow_type_rewrite();
		break;
	}

	default:
		break;
	}

	return true;
}